

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  Monitor monitor;
  allocator local_e9;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  Monitor local_88;
  
  std::__cxx11::string::string((string *)&local_c8,".",&local_e9);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(DirMonitor::Event),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]DirMonitor/example.cpp:7:26)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(DirMonitor::Event),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]DirMonitor/example.cpp:7:26)>
             ::_M_manager;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  DirMonitor::Monitor::Monitor(&local_88,&local_c8,(OnFileHandle *)&local_a8,(Scheduler *)&local_e8)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  do {
    local_e8._M_unused._M_member_pointer = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)&local_e8);
  } while( true );
}

Assistant:

int main() {
    Monitor monitor(".", [](const Event& event) {
        LOGI("Monitor: path:%s, type:%s, isAdd:%s",
                event.path.name.c_str(),
                event.path.isDir ? "dir" : "file",
                event.type == Event::Type::ADD ? "add" : "remove"
                );
    });
    for(;;) { std::this_thread::sleep_for(std::chrono::seconds(1)); };
    return 0;
}